

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
date::detail::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,
          time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_(date::detail::classify)4>
          *t)

{
  long lVar1;
  _Ios_Fmtflags __fmtfl;
  rep_conflict rVar2;
  ostream *poVar3;
  undefined1 local_30 [8];
  save_stream<char,_std::char_traits<char>_> _;
  time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_(date::detail::classify)4>
  *t_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  _._16_8_ = t;
  save_stream<char,_std::char_traits<char>_>::save_stream
            ((save_stream<char,_std::char_traits<char>_> *)local_30,os);
  if ((*(byte *)(_._16_8_ + 9) & 1) != 0) {
    std::operator<<((ostream *)os,'-');
  }
  std::ios::fill((char)os + (char)*(undefined8 *)(*(long *)os + -0x18));
  lVar1 = *(long *)(*(long *)os + -0x18);
  __fmtfl = std::operator|(_S_dec,_S_right);
  std::ios_base::flags((ios_base *)(os + lVar1),__fmtfl);
  if ((*(char *)(_._16_8_ + 8) != '\x01') && (*(char *)(_._16_8_ + 8) != '\x02')) {
    std::ios_base::width((ios_base *)(os + *(long *)(*(long *)os + -0x18)),2);
  }
  rVar2 = std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count
                    ((duration<long,_std::ratio<3600L,_1L>_> *)_._16_8_);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,rVar2);
  std::operator<<(poVar3,':');
  std::ios_base::width((ios_base *)(os + *(long *)(*(long *)os + -0x18)),2);
  rVar2 = std::chrono::duration<long,_std::ratio<60L,_1L>_>::count
                    ((duration<long,_std::ratio<60L,_1L>_> *)(_._16_8_ + 0x10));
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)os,rVar2);
  poVar3 = std::operator<<(poVar3,':');
  operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar3,
             (decimal_format_seconds<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_6U> *)
             (_._16_8_ + 0x18));
  if (*(char *)(_._16_8_ + 8) == '\x01') {
    std::operator<<((ostream *)os,"am");
  }
  else if (*(char *)(_._16_8_ + 8) == '\x02') {
    std::operator<<((ostream *)os,"pm");
  }
  save_stream<char,_std::char_traits<char>_>::~save_stream
            ((save_stream<char,_std::char_traits<char>_> *)local_30);
  return os;
}

Assistant:

std::basic_ostream<CharT, Traits>&
    operator<<(std::basic_ostream<CharT, Traits>& os, const time_of_day_storage& t)
    {
        using namespace std;
        detail::save_stream<CharT, Traits> _(os);
        if (t.neg_)
            os << '-';
        os.fill('0');
        os.flags(std::ios::dec | std::ios::right);
        if (t.mode_ != am && t.mode_ != pm)
            os.width(2);
        os << t.h_.count() << ':';
        os.width(2);
        os << t.m_.count() << ':' << t.s_;
        switch (t.mode_)
        {
        case am:
            os << "am";
            break;
        case pm:
            os << "pm";
            break;
        }
        return os;
    }